

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O2

_Bool testbinaryfuse8(size_t size,size_t repeated_size)

{
  _Bool _Var1;
  uint64_t *puVar2;
  size_t i;
  uint64_t uVar3;
  binary_fuse8_t filter;
  
  printf("testing binary fuse8 with size %zu and %zu duplicates\n",size,repeated_size);
  binary_fuse8_allocate((uint32_t)size,&filter);
  puVar2 = (uint64_t *)malloc(size * 8);
  for (uVar3 = 0; size != uVar3; uVar3 = uVar3 + 1) {
    puVar2[uVar3] = uVar3;
  }
  _Var1 = binary_fuse8_populate(puVar2,(uint32_t)size,&filter);
  if (_Var1) {
    free(puVar2);
    puVar2 = (uint64_t *)malloc((ulong)filter.ArrayLength + 0x1c);
    *puVar2 = filter.Seed;
    *(uint32_t *)(puVar2 + 1) = filter.Size;
    *(uint32_t *)((long)puVar2 + 0xc) = filter.SegmentLength;
    *(uint32_t *)(puVar2 + 2) = filter.SegmentCount;
    *(uint32_t *)((long)puVar2 + 0x14) = filter.SegmentCountLength;
    *(uint32_t *)(puVar2 + 3) = filter.ArrayLength;
    memcpy((char *)((long)puVar2 + 0x1c),filter.Fingerprints,(ulong)filter.ArrayLength);
    binary_fuse8_free(&filter);
    binary_fuse8_deserialize(&filter,(char *)puVar2);
    if (filter.Size == size) {
      free(puVar2);
      binary_fuse8_free(&filter);
      _Var1 = test(size,repeated_size,&filter,binary_fuse8_allocate_gen,binary_fuse8_free_gen,
                   binary_fuse8_size_in_bytes_gen,binary_fuse8_serialization_bytes_gen,
                   binary_fuse8_serialize_gen,binary_fuse8_deserialize_gen,binary_fuse8_populate_gen
                   ,binary_fuse8_contain_gen);
    }
    else {
      _Var1 = false;
      printf("size not (de-)serialized correctly, found %d, expected %zu.",(ulong)filter.Size,size);
      free(puVar2);
      binary_fuse8_free(&filter);
    }
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool testbinaryfuse8(size_t size, size_t repeated_size) {
  printf("testing binary fuse8 with size %zu and %zu duplicates\n", size, repeated_size);
  binary_fuse8_t filter;

  // size serialization test
  binary_fuse8_allocate((uint32_t)size, &filter);
  uint64_t *big_set = (uint64_t *)malloc(sizeof(uint64_t) * size);
  for (size_t i = 0; i < size; i++) {
    big_set[i] = i;
  }
  if (!binary_fuse8_populate(big_set, (uint32_t)size, &filter)) {
    return false;
  }
  free(big_set);

  size_t buffer_size = binary_fuse8_serialization_bytes(&filter);
  char *buffer = (char *)malloc(buffer_size);
  binary_fuse8_serialize(&filter, buffer);
  binary_fuse8_free(&filter);
  binary_fuse8_deserialize(&filter, buffer);

  if (filter.Size != size) {
    printf("size not (de-)serialized correctly, found %d, expected %zu.",
           filter.Size, size);
    free(buffer);
    binary_fuse8_free(&filter);
    return false;
  }
  free(buffer);
  binary_fuse8_free(&filter);
  // end of size serialization test

  return test(size, repeated_size, &filter,
              binary_fuse8_allocate_gen,
              binary_fuse8_free_gen,
              binary_fuse8_size_in_bytes_gen,
              binary_fuse8_serialization_bytes_gen,
              binary_fuse8_serialize_gen,
              binary_fuse8_deserialize_gen,
              binary_fuse8_populate_gen,
              binary_fuse8_contain_gen);
}